

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall QWidgetRepaintManager::~QWidgetRepaintManager(QWidgetRepaintManager *this)

{
  QWidgetRepaintManager *this_00;
  qsizetype qVar1;
  QWidget *widget;
  long in_RDI;
  int c_1;
  int c;
  QWidget *in_stack_ffffffffffffffd8;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    this_00 = (QWidgetRepaintManager *)(long)local_c;
    qVar1 = QList<QWidget_*>::size((QList<QWidget_*> *)(in_RDI + 0x18));
    if (qVar1 <= (long)this_00) break;
    QList<QWidget_*>::at((QList<QWidget_*> *)this_00,(qsizetype)in_stack_ffffffffffffffd8);
    resetWidget(this_00,in_stack_ffffffffffffffd8);
    local_c = local_c + 1;
  }
  local_10 = 0;
  while( true ) {
    widget = (QWidget *)(long)local_10;
    qVar1 = QList<QWidget_*>::size((QList<QWidget_*> *)(in_RDI + 0x30));
    if (qVar1 <= (long)widget) break;
    QList<QWidget_*>::at((QList<QWidget_*> *)this_00,(qsizetype)widget);
    resetWidget(this_00,widget);
    local_10 = local_10 + 1;
  }
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a4997);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a49a5);
  QRegion::~QRegion((QRegion *)(in_RDI + 0x48));
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a49c1);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x3a49cf);
  QRegion::~QRegion((QRegion *)(in_RDI + 0x10));
  return;
}

Assistant:

QWidgetRepaintManager::~QWidgetRepaintManager()
{
    for (int c = 0; c < dirtyWidgets.size(); ++c)
        resetWidget(dirtyWidgets.at(c));
    for (int c = 0; c < dirtyRenderToTextureWidgets.size(); ++c)
        resetWidget(dirtyRenderToTextureWidgets.at(c));
}